

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_94(QPDF *pdf,char *arg2)

{
  undefined8 uVar1;
  element_type *peVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  QPDFObjectHandle root_media;
  string root_media_unparse;
  QPDFObjectHandle p5_new_bleed;
  QPDFObjectHandle p1_new_art;
  QPDFObjectHandle p5_new_crop;
  QPDFObjectHandle p5_new_media;
  QPDFObjectHandle p4_crop;
  QPDFObjectHandle p4_orig_crop;
  QPDFObjectHandle p1_new_crop;
  QPDFObjectHandle p4_new_crop;
  QPDFObjectHandle p4_bleed1;
  QPDFObjectHandle p2_new_trim;
  QPDFObjectHandle p2_crop;
  QPDFObjectHandle p1_effective_media;
  QPDFObjectHandle p4_art2;
  QPDFObjectHandle p4_art1;
  QPDFObjectHandle p4_bleed2;
  QPDFObjectHandle p3_crop;
  QPDFObjectHandle p3_media;
  QPDFObjectHandle pages_root;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  undefined1 local_1c8 [16];
  element_type *local_1b8 [2];
  string local_1a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  long *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  long local_188 [2];
  QPDFObjectHandle local_178;
  long local_168 [2];
  QPDFObjectHandle local_158;
  QPDFObjectHandle local_148;
  QPDFObjectHandle local_138;
  undefined1 local_128 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  QPDFObjectHandle local_f8;
  QPDFObjectHandle local_e8;
  QPDFObjectHandle local_d8;
  undefined1 local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  QPDFObjectHandle local_b8;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  undefined1 local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined1 local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48;
  long local_40;
  
  QPDF::getRoot();
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/Pages","");
  QPDFObjectHandle::getKey(local_58);
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/MediaBox","");
  QPDFObjectHandle::getKey(local_1a8);
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1c8,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1c8);
  if (local_40 - local_48 != 0x118) {
    __assert_fail("pages.size() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcec,"void test_94(QPDF &, const char *)");
  }
  local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(local_48 + 8);
  local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_48 + 0x10);
  if (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_158.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_158.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  local_1c8._0_8_ = (element_type *)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"/MediaBox","");
  QPDFObjectHandle::getKey((string *)&local_178);
  cVar3 = QPDFObjectHandle::isNull();
  if (cVar3 == '\0') {
    __assert_fail("p1.getObjectHandle().getKey(\"/MediaBox\").isNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf3,"void test_94(QPDF &, const char *)");
  }
  if (local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((element_type *)local_1c8._0_8_ != (element_type *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8[0] + 1));
  }
  if (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  bVar7 = SUB81(local_1c8,0);
  QPDFPageObjectHelper::getMediaBox(bVar7);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf5,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  bVar6 = SUB81(local_48,0);
  QPDFPageObjectHelper::getCropBox(bVar7,bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p1.getCropBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf7,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getBleedBox(bVar7,bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p1.getBleedBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf8,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getTrimBox(bVar7,bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf9,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getArtBox(bVar7,bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p1.getArtBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfa,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&local_158,0),bVar6);
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar1 = local_1c8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ != local_190) {
LAB_0013e449:
    __assert_fail("p1_new_art.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfd,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = bcmp((void *)local_1c8._0_8_,local_198,local_1c8._8_8_);
    if (iVar4 != 0) goto LAB_0013e449;
  }
  if ((element_type *)uVar1 != (element_type *)local_1b8) {
    operator_delete((void *)uVar1,(ulong)(local_1b8[0] + 1));
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_158);
  if (cVar3 != '\0') {
    __assert_fail("!p1_new_art.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfe,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(SUB81(&local_108,0),bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_108);
  if (cVar3 != '\0') {
    __assert_fail("!p1_new_crop.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd01,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_108);
  if (cVar3 != '\0') {
    __assert_fail("!p1_new_crop.isSameObjectAs(p1_new_art)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd02,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar1 = local_1c8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ != local_190) {
LAB_0013e468:
    __assert_fail("p1_new_crop.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd03,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = bcmp((void *)local_1c8._0_8_,local_198,local_1c8._8_8_);
    if (iVar4 != 0) goto LAB_0013e468;
  }
  if ((element_type *)uVar1 != (element_type *)local_1b8) {
    operator_delete((void *)uVar1,(ulong)(local_1b8[0] + 1));
  }
  QPDFPageObjectHelper::getMediaBox(bVar7);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd05,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getTrimBox(bVar7,bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd07,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_b8,0));
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar1 = local_1c8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ != local_190) {
LAB_0013e487:
    __assert_fail("p1_effective_media.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0b,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = bcmp((void *)local_1c8._0_8_,local_198,local_1c8._8_8_);
    if (iVar4 != 0) goto LAB_0013e487;
  }
  if ((element_type *)uVar1 != (element_type *)local_1b8) {
    operator_delete((void *)uVar1,(ulong)(local_1b8[0] + 1));
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_b8);
  if (cVar3 != '\0') {
    __assert_fail("!p1_effective_media.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0c,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox(bVar7);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0f,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getCropBox(SUB81(local_c8,0),(bool)(bVar6 + '8'));
  QPDFPageObjectHelper::getTrimBox(SUB81(&local_d8,0),(bool)(bVar6 + '8'));
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi) {
LAB_0013e4a6:
    __assert_fail("p2_new_trim.unparse() == p2_crop.unparse()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd12,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = bcmp((void *)local_1c8._0_8_,
                 local_178.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_1c8._8_8_);
    if (iVar4 != 0) goto LAB_0013e4a6;
  }
  if (local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_168) {
    operator_delete(local_178.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_168[0] + 1);
  }
  if ((element_type *)local_1c8._0_8_ != (element_type *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8[0] + 1));
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_d8);
  if (cVar3 != '\0') {
    __assert_fail("!p2_new_trim.isSameObjectAs(p2_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd13,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox(bVar7);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd14,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(local_68,0));
  QPDFPageObjectHelper::getCropBox(SUB81(local_78,0),(bool)(bVar6 + 'p'));
  QPDFPageObjectHelper::getMediaBox(bVar7);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p3.getMediaBox(true).isSameObjectAs(p3_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd19,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getCropBox(bVar7,(bool)(bVar6 + 'p'));
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p3.getCropBox(true, true).isSameObjectAs(p3_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1a,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(local_48 + 0xb0);
  local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_48 + 0xb8);
  if (local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_178.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_178.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  local_1c8._0_8_ = (element_type *)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"/CropBox","");
  QPDFObjectHandle::getKey((string *)&local_118);
  if ((element_type *)local_1c8._0_8_ != (element_type *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8[0] + 1));
  }
  bVar5 = (bool)(bVar6 + -0x58);
  if (local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFPageObjectHelper::getCropBox(SUB81(local_128,0),bVar5);
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_118);
  if (cVar3 == '\0') {
    __assert_fail("p4_orig_crop.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1f,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getBleedBox(SUB81(&local_e8,0),bVar5);
  QPDFPageObjectHelper::getBleedBox(SUB81(local_88,0),bVar5);
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_e8);
  if (cVar3 != '\0') {
    __assert_fail("!p4_bleed1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd22,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_e8);
  if (cVar3 == '\0') {
    __assert_fail("p4_bleed1.isSameObjectAs(p4_bleed2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd23,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&local_98,0),bVar5);
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_98);
  if (cVar3 == '\0') {
    __assert_fail("p4_art1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd25,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&local_a8,0),bVar5);
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_a8);
  if (cVar3 != '\0') {
    __assert_fail("!p4_art2.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd27,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(SUB81(&local_f8,0),bVar5);
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_f8);
  if (cVar3 != '\0') {
    __assert_fail("!p4_new_crop.isSameObjectAs(p4_orig_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd29,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isIndirect();
  if (cVar3 == '\0') {
    __assert_fail("p4_orig_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2a,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isIndirect();
  if (cVar3 != '\0') {
    __assert_fail("!p4_new_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2b,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparseResolved_abi_cxx11_();
  peVar2 = local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi) {
LAB_0013e4c5:
    __assert_fail("p4_new_crop.unparse() == p4_orig_crop.unparseResolved()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2c,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = bcmp((void *)local_1c8._0_8_,
                 local_178.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_1c8._8_8_);
    if (iVar4 != 0) goto LAB_0013e4c5;
  }
  if (peVar2 != (element_type *)local_168) {
    operator_delete(peVar2,local_168[0] + 1);
  }
  bVar6 = (bool)(bVar6 + -0x20);
  if ((element_type *)local_1c8._0_8_ != (element_type *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8[0] + 1));
  }
  QPDFPageObjectHelper::getMediaBox(bVar7);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p5.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2f,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getCropBox(bVar7,bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p5.getCropBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd30,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getBleedBox(bVar7,bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c8);
  if (cVar3 == '\0') {
    __assert_fail("p5.getBleedBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd31,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  QPDFPageObjectHelper::getBleedBox(SUB81(&local_178,0),bVar6);
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_138,0));
  QPDFPageObjectHelper::getCropBox(SUB81(&local_148,0),bVar6);
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_138);
  if (cVar3 != '\0') {
    __assert_fail("!p5_new_media.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd35,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_148);
  if (cVar3 != '\0') {
    __assert_fail("!p5_new_crop.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd36,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_148);
  if (cVar3 != '\0') {
    __assert_fail("!p5_new_crop.isSameObjectAs(p5_new_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd37,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_178);
  if (cVar3 != '\0') {
    __assert_fail("!p5_new_bleed.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd38,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_178);
  if (cVar3 != '\0') {
    __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd39,"void test_94(QPDF &, const char *)");
  }
  cVar3 = QPDFObjectHandle::isSameObjectAs(&local_178);
  if (cVar3 != '\0') {
    __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3a,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar1 = local_1c8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ != local_190) {
LAB_0013e4e4:
    __assert_fail("p5_new_media.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3b,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = bcmp((void *)local_1c8._0_8_,local_198,local_1c8._8_8_);
    if (iVar4 != 0) goto LAB_0013e4e4;
  }
  if ((element_type *)uVar1 != (element_type *)local_1b8) {
    operator_delete((void *)uVar1,(ulong)(local_1b8[0] + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar1 = local_1c8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ != local_190) {
LAB_0013e503:
    __assert_fail("p5_new_crop.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3c,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = bcmp((void *)local_1c8._0_8_,local_198,local_1c8._8_8_);
    if (iVar4 != 0) goto LAB_0013e503;
  }
  if ((element_type *)uVar1 != (element_type *)local_1b8) {
    operator_delete((void *)uVar1,(ulong)(local_1b8[0] + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar1 = local_1c8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ == local_190) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = bcmp((void *)local_1c8._0_8_,local_198,local_1c8._8_8_);
      if (iVar4 != 0) goto LAB_0013e522;
    }
    if ((element_type *)uVar1 != (element_type *)local_1b8) {
      operator_delete((void *)uVar1,(ulong)(local_1b8[0] + 1));
    }
    if (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_138.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_178.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_48);
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    return;
  }
LAB_0013e522:
  __assert_fail("p5_new_bleed.unparse() == root_media_unparse",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xd3d,"void test_94(QPDF &, const char *)");
}

Assistant:

static void
test_94(QPDF& pdf, char const* arg2)
{
    // Exercise methods to get page boxes. This test is built for
    // boxes2.pdf.

    // /MediaBox is present in the pages tree root.
    // Each page has the following boxes present directly:
    // 1. none
    // 2. crop
    // 3. media, crop
    // 4. media, crop, trim, bleed; crop is indirect
    // 5. trim, art

    auto pages_root = pdf.getRoot().getKey("/Pages");
    auto root_media = pages_root.getKey("/MediaBox");
    auto root_media_unparse = root_media.unparse();
    auto pages = QPDFPageDocumentHelper(pdf).getAllPages();
    assert(pages.size() == 5);
    auto& p1 = pages[0];
    auto& p2 = pages[1];
    auto& p3 = pages[2];
    auto& p4 = pages[3];
    auto& p5 = pages[4];

    assert(p1.getObjectHandle().getKey("/MediaBox").isNull());
    // MediaBox not present, so get inherited one
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Other boxesBox not present, so fall back to MediaBox
    assert(p1.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p1.getBleedBox(false, false).isSameObjectAs(root_media));
    assert(p1.getTrimBox(false, false).isSameObjectAs(root_media));
    assert(p1.getArtBox(false, false).isSameObjectAs(root_media));
    // Make copy of artbox
    auto p1_new_art = p1.getArtBox(false, true);
    assert(p1_new_art.unparse() == root_media_unparse);
    assert(!p1_new_art.isSameObjectAs(root_media));
    // This also copied cropbox
    auto p1_new_crop = p1.getCropBox(false, false);
    assert(!p1_new_crop.isSameObjectAs(root_media));
    assert(!p1_new_crop.isSameObjectAs(p1_new_art));
    assert(p1_new_crop.unparse() == root_media_unparse);
    // But it didn't copy Media
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Now fall back to new crop
    assert(p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop));
    // Request copy. The value returned has the same structure but is
    // a different object.
    auto p1_effective_media = p1.getMediaBox(true);
    assert(p1_effective_media.unparse() == root_media_unparse);
    assert(!p1_effective_media.isSameObjectAs(root_media));

    // copy_on_fallback didn't have to copy media to crop
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));
    auto p2_crop = p2.getCropBox(false, false);
    auto p2_new_trim = p2.getTrimBox(false, true);
    assert(p2_new_trim.unparse() == p2_crop.unparse());
    assert(!p2_new_trim.isSameObjectAs(p2_crop));
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));

    // We didn't need to copy anything
    auto p3_media = p3.getMediaBox(false);
    auto p3_crop = p3.getCropBox(false, false);
    assert(p3.getMediaBox(true).isSameObjectAs(p3_media));
    assert(p3.getCropBox(true, true).isSameObjectAs(p3_crop));

    // We didn't have to copy for bleed but we did for art
    auto p4_orig_crop = p4.getObjectHandle().getKey("/CropBox");
    auto p4_crop = p4.getCropBox(false, false);
    assert(p4_orig_crop.isSameObjectAs(p4_crop));
    auto p4_bleed1 = p4.getBleedBox(false, false);
    auto p4_bleed2 = p4.getBleedBox(false, true);
    assert(!p4_bleed1.isSameObjectAs(p4_crop));
    assert(p4_bleed1.isSameObjectAs(p4_bleed2));
    auto p4_art1 = p4.getArtBox(false, false);
    assert(p4_art1.isSameObjectAs(p4_crop));
    auto p4_art2 = p4.getArtBox(false, true);
    assert(!p4_art2.isSameObjectAs(p4_crop));
    auto p4_new_crop = p4.getCropBox(true, false);
    assert(!p4_new_crop.isSameObjectAs(p4_orig_crop));
    assert(p4_orig_crop.isIndirect());
    assert(!p4_new_crop.isIndirect());
    assert(p4_new_crop.unparse() == p4_orig_crop.unparseResolved());

    // Exercise copying for inheritance and fallback
    assert(p5.getMediaBox(false).isSameObjectAs(root_media));
    assert(p5.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p5.getBleedBox(false, false).isSameObjectAs(root_media));
    auto p5_new_bleed = p5.getBleedBox(true, true);
    auto p5_new_media = p5.getMediaBox(false);
    auto p5_new_crop = p5.getCropBox(false, false);
    assert(!p5_new_media.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(root_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_crop));
    assert(p5_new_media.unparse() == root_media_unparse);
    assert(p5_new_crop.unparse() == root_media_unparse);
    assert(p5_new_bleed.unparse() == root_media_unparse);
}